

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O1

int __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::vSolveUpdateRight(CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    *this,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *vec,int *ridx,int n,
                   number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *eps)

{
  uint *puVar1;
  int iVar2;
  undefined8 uVar3;
  undefined1 auVar4 [16];
  int iVar5;
  int iVar6;
  uint uVar7;
  long lVar8;
  cpp_dec_float<50U,_int,_void> *v;
  cpp_dec_float<50U,_int,_void> *pcVar9;
  long lVar10;
  int *piVar11;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar12;
  type t;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  x;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  cpp_dec_float<50U,_int,_void> local_1b8;
  cpp_dec_float<50U,_int,_void> local_178;
  int local_13c;
  uint local_138;
  int local_134;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_130;
  cpp_dec_float<50U,_int,_void> local_128;
  int *local_e8;
  pointer local_e0;
  int *local_d8;
  int *local_d0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_c8;
  long local_c0;
  int *local_b8;
  long local_b0;
  cpp_dec_float<50U,_int,_void> local_a8;
  cpp_dec_float<50U,_int,_void> local_68;
  
  local_178.fpclass = cpp_dec_float_finite;
  local_178.prec_elem = 10;
  local_178.data._M_elems[0] = 0;
  local_178.data._M_elems[1] = 0;
  local_178.data._M_elems[2] = 0;
  local_178.data._M_elems[3] = 0;
  local_178.data._M_elems[4] = 0;
  local_178.data._M_elems[5] = 0;
  local_178.data._M_elems._24_5_ = 0;
  local_178.data._M_elems[7]._1_3_ = 0;
  local_178.data._M_elems._32_5_ = 0;
  local_178.data._M_elems[9]._1_3_ = 0;
  local_178.exp = 0;
  local_178.neg = false;
  local_13c = (this->l).firstUnused;
  iVar5 = (this->l).firstUpdate;
  lVar10 = (long)iVar5;
  if (iVar5 < local_13c) {
    local_e0 = (this->l).val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    local_e8 = (this->l).idx;
    local_d0 = (this->l).row;
    local_d8 = (this->l).start;
    local_130 = vec;
    local_c8 = eps;
    local_b8 = ridx;
    do {
      iVar5 = local_d0[lVar10];
      local_128.data._M_elems._32_8_ = *(undefined8 *)(vec[iVar5].m_backend.data._M_elems + 8);
      local_128.data._M_elems._0_16_ = *(undefined1 (*) [16])vec[iVar5].m_backend.data._M_elems;
      puVar1 = vec[iVar5].m_backend.data._M_elems + 4;
      local_128.data._M_elems._16_8_ = *(undefined8 *)puVar1;
      uVar3 = *(undefined8 *)(puVar1 + 2);
      local_128.data._M_elems._24_5_ = SUB85(uVar3,0);
      local_128.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
      local_1b8.exp = vec[iVar5].m_backend.exp;
      local_128.neg = vec[iVar5].m_backend.neg;
      local_128.fpclass = vec[iVar5].m_backend.fpclass;
      local_128.prec_elem = vec[iVar5].m_backend.prec_elem;
      uVar3 = *(undefined8 *)(vec[iVar5].m_backend.data._M_elems + 8);
      local_1b8.data._M_elems._32_5_ = SUB85(uVar3,0);
      local_1b8.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
      local_1b8.data._M_elems._0_8_ = *(undefined8 *)vec[iVar5].m_backend.data._M_elems;
      local_1b8.data._M_elems._8_8_ = *(undefined8 *)(vec[iVar5].m_backend.data._M_elems + 2);
      puVar1 = vec[iVar5].m_backend.data._M_elems + 4;
      local_1b8.data._M_elems._16_8_ = *(undefined8 *)puVar1;
      uVar3 = *(undefined8 *)(puVar1 + 2);
      local_1b8.data._M_elems._24_5_ = SUB85(uVar3,0);
      local_1b8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
      local_68.data._M_elems._0_8_ = *(undefined8 *)(local_c8->m_backend).data._M_elems;
      local_68.data._M_elems._8_8_ = *(undefined8 *)((local_c8->m_backend).data._M_elems + 2);
      local_68.data._M_elems._16_8_ = *(undefined8 *)((local_c8->m_backend).data._M_elems + 4);
      local_68.data._M_elems._24_8_ = *(undefined8 *)((local_c8->m_backend).data._M_elems + 6);
      local_68.data._M_elems._32_8_ = *(undefined8 *)((local_c8->m_backend).data._M_elems + 8);
      local_68.exp = (local_c8->m_backend).exp;
      local_68.neg = (local_c8->m_backend).neg;
      local_68.fpclass = (local_c8->m_backend).fpclass;
      local_68.prec_elem = (local_c8->m_backend).prec_elem;
      local_1b8.prec_elem = local_128.prec_elem;
      local_1b8.fpclass = local_128.fpclass;
      local_1b8.neg = local_128.neg;
      if ((local_128.neg == true) &&
         (local_1b8.data._M_elems[0] != 0 || local_128.fpclass != cpp_dec_float_finite)) {
        local_1b8.neg = false;
      }
      local_c0 = lVar10;
      if ((local_68.fpclass != cpp_dec_float_NaN && local_128.fpclass != cpp_dec_float_NaN) &&
         (local_128.exp = local_1b8.exp,
         iVar5 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                           (&local_1b8,&local_68), 0 < iVar5)) {
        lVar8 = (long)local_d8[lVar10];
        iVar5 = local_d8[lVar10 + 1];
        if (local_d8[lVar10] < iVar5) {
          pcVar9 = &local_e0[lVar8].m_backend;
          piVar11 = local_e8 + lVar8;
          local_b0 = lVar8;
          do {
            iVar2 = *piVar11;
            local_b8[n] = iVar2;
            local_178.data._M_elems._32_8_ = *(undefined8 *)(vec[iVar2].m_backend.data._M_elems + 8)
            ;
            local_178.data._M_elems._0_8_ = *(undefined8 *)vec[iVar2].m_backend.data._M_elems;
            local_178.data._M_elems._8_8_ = *(undefined8 *)(vec[iVar2].m_backend.data._M_elems + 2);
            puVar1 = vec[iVar2].m_backend.data._M_elems + 4;
            local_178.data._M_elems._16_8_ = *(undefined8 *)puVar1;
            uVar3 = *(undefined8 *)(puVar1 + 2);
            local_178.data._M_elems._24_5_ = SUB85(uVar3,0);
            local_178.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
            local_178.exp = vec[iVar2].m_backend.exp;
            local_178.neg = vec[iVar2].m_backend.neg;
            local_178.fpclass = vec[iVar2].m_backend.fpclass;
            local_178.prec_elem = vec[iVar2].m_backend.prec_elem;
            uVar7 = 0;
            local_134 = n;
            if (local_178.fpclass != cpp_dec_float_NaN) {
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
              cpp_dec_float<long_long>(&local_1b8,0,(type *)0x0);
              iVar6 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                (&local_178,&local_1b8);
              uVar7 = (uint)(iVar6 == 0);
            }
            auVar4 = (undefined1  [16])local_128.data._M_elems._0_16_;
            local_a8.fpclass = cpp_dec_float_finite;
            local_a8.prec_elem = 10;
            local_a8.data._M_elems[0] = 0;
            local_a8.data._M_elems[1] = 0;
            local_a8.data._M_elems[2] = 0;
            local_a8.data._M_elems[3] = 0;
            local_a8.data._M_elems[4] = 0;
            local_a8.data._M_elems[5] = 0;
            local_a8.data._M_elems._24_5_ = 0;
            local_a8.data._M_elems[7]._1_3_ = 0;
            local_a8.data._M_elems._32_5_ = 0;
            local_a8.data._M_elems[9]._1_3_ = 0;
            local_a8.exp = 0;
            local_a8.neg = false;
            v = &local_128;
            if (pcVar9 != &local_a8) {
              local_a8.data._M_elems._32_5_ = local_128.data._M_elems._32_5_;
              local_a8.data._M_elems[9]._1_3_ = local_128.data._M_elems[9]._1_3_;
              local_a8.data._M_elems[4] = local_128.data._M_elems[4];
              local_a8.data._M_elems[5] = local_128.data._M_elems[5];
              local_a8.data._M_elems._24_5_ = local_128.data._M_elems._24_5_;
              local_a8.data._M_elems[7]._1_3_ = local_128.data._M_elems[7]._1_3_;
              local_a8.data._M_elems[0] = local_128.data._M_elems[0];
              local_a8.data._M_elems[1] = local_128.data._M_elems[1];
              local_a8.data._M_elems[2] = local_128.data._M_elems[2];
              local_a8.data._M_elems[3] = local_128.data._M_elems[3];
              local_a8.exp = local_128.exp;
              local_a8.neg = local_128.neg;
              local_a8.fpclass = local_128.fpclass;
              local_a8.prec_elem = local_128.prec_elem;
              v = pcVar9;
            }
            local_138 = uVar7;
            local_128.data._M_elems._0_16_ = auVar4;
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=(&local_a8,v);
            local_1b8.data._M_elems._32_5_ = local_178.data._M_elems._32_5_;
            local_1b8.data._M_elems[9]._1_3_ = local_178.data._M_elems[9]._1_3_;
            local_1b8.data._M_elems[4] = local_178.data._M_elems[4];
            local_1b8.data._M_elems[5] = local_178.data._M_elems[5];
            local_1b8.data._M_elems._24_5_ = local_178.data._M_elems._24_5_;
            local_1b8.data._M_elems[7]._1_3_ = local_178.data._M_elems[7]._1_3_;
            local_1b8.data._M_elems[0] = local_178.data._M_elems[0];
            local_1b8.data._M_elems[1] = local_178.data._M_elems[1];
            local_1b8.data._M_elems[2] = local_178.data._M_elems[2];
            local_1b8.data._M_elems[3] = local_178.data._M_elems[3];
            local_1b8.exp = local_178.exp;
            local_1b8.neg = local_178.neg;
            local_1b8.fpclass = local_178.fpclass;
            local_1b8.prec_elem = local_178.prec_elem;
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                      (&local_1b8,&local_a8);
            local_178.data._M_elems[0] = local_1b8.data._M_elems[0];
            local_178.data._M_elems[1] = local_1b8.data._M_elems[1];
            local_178.data._M_elems[2] = local_1b8.data._M_elems[2];
            local_178.data._M_elems[3] = local_1b8.data._M_elems[3];
            local_178.data._M_elems[4] = local_1b8.data._M_elems[4];
            local_178.data._M_elems[5] = local_1b8.data._M_elems[5];
            local_178.data._M_elems._24_5_ = local_1b8.data._M_elems._24_5_;
            local_178.data._M_elems[7]._1_3_ = local_1b8.data._M_elems[7]._1_3_;
            local_178.data._M_elems._32_5_ = local_1b8.data._M_elems._32_5_;
            local_178.data._M_elems[9]._1_3_ = local_1b8.data._M_elems[9]._1_3_;
            local_178.exp = local_1b8.exp;
            local_178.neg = local_1b8.neg;
            local_178.fpclass = local_1b8.fpclass;
            local_178.prec_elem = local_1b8.prec_elem;
            if (local_1b8.fpclass == cpp_dec_float_NaN) {
LAB_00288f41:
              local_1b8.data._M_elems._32_5_ = local_178.data._M_elems._32_5_;
              local_1b8.data._M_elems[9]._1_3_ = local_178.data._M_elems[9]._1_3_;
              local_1b8.data._M_elems[4] = local_178.data._M_elems[4];
              local_1b8.data._M_elems[5] = local_178.data._M_elems[5];
              local_1b8.data._M_elems._24_5_ = local_178.data._M_elems._24_5_;
              local_1b8.data._M_elems[7]._1_3_ = local_178.data._M_elems[7]._1_3_;
              local_1b8.data._M_elems[0] = local_178.data._M_elems[0];
              local_1b8.data._M_elems[1] = local_178.data._M_elems[1];
              local_1b8.data._M_elems[2] = local_178.data._M_elems[2];
              local_1b8.data._M_elems[3] = local_178.data._M_elems[3];
              local_1b8.exp = local_178.exp;
              local_1b8.neg = local_178.neg;
              local_1b8.fpclass = local_178.fpclass;
              local_1b8.prec_elem = local_178.prec_elem;
            }
            else {
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
              cpp_dec_float<long_long>(&local_1b8,0,(type *)0x0);
              iVar6 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                (&local_178,&local_1b8);
              if (iVar6 != 0) goto LAB_00288f41;
              local_1b8.fpclass = cpp_dec_float_finite;
              local_1b8.prec_elem = 10;
              local_1b8.data._M_elems[0] = 0;
              local_1b8.data._M_elems[1] = 0;
              local_1b8.data._M_elems[2] = 0;
              local_1b8.data._M_elems[3] = 0;
              local_1b8.data._M_elems[4] = 0;
              local_1b8.data._M_elems[5] = 0;
              local_1b8.data._M_elems._24_5_ = 0;
              local_1b8.data._M_elems[7]._1_3_ = 0;
              local_1b8.data._M_elems._32_5_ = 0;
              local_1b8.data._M_elems[9]._1_3_ = 0;
              local_1b8.exp = 0;
              local_1b8.neg = false;
              boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                        ((cpp_dec_float<50u,int,void> *)&local_1b8,1e-100);
            }
            piVar11 = piVar11 + 1;
            pnVar12 = local_130 + iVar2;
            n = local_134 + local_138;
            pcVar9 = pcVar9 + 1;
            *(ulong *)((pnVar12->m_backend).data._M_elems + 8) =
                 CONCAT35(local_1b8.data._M_elems[9]._1_3_,local_1b8.data._M_elems._32_5_);
            *(undefined8 *)((pnVar12->m_backend).data._M_elems + 4) = local_1b8.data._M_elems._16_8_
            ;
            *(ulong *)((pnVar12->m_backend).data._M_elems + 6) =
                 CONCAT35(local_1b8.data._M_elems[7]._1_3_,local_1b8.data._M_elems._24_5_);
            *(undefined8 *)(pnVar12->m_backend).data._M_elems = local_1b8.data._M_elems._0_8_;
            *(undefined8 *)((pnVar12->m_backend).data._M_elems + 2) = local_1b8.data._M_elems._8_8_;
            (pnVar12->m_backend).exp = local_1b8.exp;
            (pnVar12->m_backend).neg = local_1b8.neg;
            (pnVar12->m_backend).fpclass = local_1b8.fpclass;
            (pnVar12->m_backend).prec_elem = local_1b8.prec_elem;
            iVar5 = iVar5 + -1;
            vec = local_130;
          } while ((int)local_b0 < iVar5);
        }
      }
      lVar10 = local_c0 + 1;
    } while (local_13c != (int)lVar10);
  }
  return n;
}

Assistant:

int CLUFactor<R>::vSolveUpdateRight(R* vec, int* ridx, int n, R eps)
{
   int i, j, k;
   int end;
   R x, y;
   R* lval, *val;
   int* lrow, *lidx, *idx;
   int* lbeg;

   assert(!l.updateType);               /* no Forest-Tomlin Updates */

   lval = l.val.data();
   lidx = l.idx;
   lrow = l.row;
   lbeg = l.start;
   end = l.firstUnused;

   for(i = l.firstUpdate; i < end; ++i)
   {
      assert(i >= 0 && i < thedim);
      x = vec[lrow[i]];

      if(isNotZero(x, eps))
      {
         k = lbeg[i];
         assert(k >= 0 && k < l.size);
         idx = &(lidx[k]);
         val = &(lval[k]);

         for(j = lbeg[i + 1]; j > k; --j)
         {
            int m = ridx[n] = *idx++;
            assert(m >= 0 && m < thedim);
            y = vec[m];
            n += (y == 0) ? 1 : 0;
            y = y - x * (*val++);
            vec[m] = (y != 0) ? y : SOPLEX_FACTOR_MARKER;
         }
      }
   }

   return n;
}